

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSNet.h
# Opt level: O2

int inittcpsrv(SOCKET *pSock,char *address,char *port,int maxnbcli,int timeout)

{
  int iVar1;
  SOCKET sock;
  sockaddr local_40;
  
  iVar1 = socket(2,1,6);
  *pSock = iVar1;
  if (iVar1 == -1) {
    return 1;
  }
  iVar1 = setsockettimeouts(iVar1,timeout);
  sock = *pSock;
  if (iVar1 == 0) {
    iVar1 = setsocketreuseaddr(sock,1);
    if (iVar1 == 0) {
      local_40.sa_data[6] = '\0';
      local_40.sa_data[7] = '\0';
      local_40.sa_data[8] = '\0';
      local_40.sa_data[9] = '\0';
      local_40.sa_data[10] = '\0';
      local_40.sa_data[0xb] = '\0';
      local_40.sa_data[0xc] = '\0';
      local_40.sa_data[0xd] = '\0';
      local_40.sa_family = 2;
      iVar1 = atoi(port);
      local_40.sa_data._0_2_ = (ushort)iVar1 << 8 | (ushort)iVar1 >> 8;
      local_40.sa_data._2_4_ = inet_addr(address);
      iVar1 = bind(*pSock,&local_40,0x10);
      sock = *pSock;
      if (iVar1 != 0) goto LAB_0010e998;
      iVar1 = listen(sock,maxnbcli);
      if (iVar1 == 0) {
        return 0;
      }
    }
    sock = *pSock;
  }
LAB_0010e998:
  close(sock);
  return 1;
}

Assistant:

inline int inittcpsrv(SOCKET* pSock, char* address, char* port, int maxnbcli, int timeout)
{
	struct sockaddr_in sa;

#ifdef _WIN32
	WSADATA wsaData;
#endif // _WIN32

#ifdef _WIN32
	// Initiate use of the Winsock 2 DLL (WS2_32.dll) by a process.
	if (WSAStartup(MAKEWORD(2,2), &wsaData) != EXIT_SUCCESS)
	{
		PRINT_DEBUG_ERROR_OSNET(("inittcpsrv error (%s) : %s(address=%s, port=%s, maxnbcli=%d, timeout=%d)\n", 
			strtime_m(), 
			"WSAStartup failed. ", 
			address, port, maxnbcli, timeout));
		return EXIT_FAILURE;
	}
#endif // _WIN32

	// Create a TCP IPv4 socket.
	*pSock = socket(AF_INET, SOCK_STREAM, IPPROTO_TCP);
	if (*pSock == INVALID_SOCKET)
	{
		PRINT_DEBUG_ERROR_OSNET(("inittcpsrv error (%s) : %s(address=%s, port=%s, maxnbcli=%d, timeout=%d)\n", 
			strtime_m(), 
			"socket failed. ", 
			address, port, maxnbcli, timeout));
#ifdef _WIN32
		WSACleanup();
#endif // _WIN32
		return EXIT_FAILURE;
	}

	// Configure timeouts for send and recv.
	if (setsockettimeouts(*pSock, timeout) != EXIT_SUCCESS)
	{
		PRINT_DEBUG_ERROR_OSNET(("inittcpsrv error (%s) : %s(address=%s, port=%s, maxnbcli=%d, timeout=%d)\n", 
			strtime_m(), 
			"setsockettimeouts failed. ", 
			address, port, maxnbcli, timeout));
		closesocket(*pSock);
#ifdef _WIN32
		WSACleanup();
#endif // _WIN32
		return EXIT_FAILURE;
	}

#ifndef DISABLE_TCPSERVER_SO_REUSEADDR
	// Enable immediate reuse of the address and port.
	if (setsocketreuseaddr(*pSock, TRUE) != EXIT_SUCCESS)
	{
		PRINT_DEBUG_ERROR_OSNET(("inittcpsrv error (%s) : %s(address=%s, port=%s, maxnbcli=%d, timeout=%d)\n",
			strtime_m(),
			"setsocketreuseaddr failed. ",
			address, port, maxnbcli, timeout));
		closesocket(*pSock);
#ifdef _WIN32
		WSACleanup();
#endif // _WIN32
		return EXIT_FAILURE;
	}
#endif // DISABLE_TCPSERVER_SO_REUSEADDR

	memset(&sa, 0, sizeof(sa));

	// The sockaddr_in structure specifies the address family,
	// IP address, and port of the server.
	sa.sin_family = AF_INET;
	sa.sin_port = htons((unsigned short)atoi(port));
	sa.sin_addr.s_addr = inet_addr(address);

	// Associate the server to the desired address and port.
	if (bind(*pSock, (struct sockaddr*)&sa, sizeof(sa)) != EXIT_SUCCESS)
	{
		PRINT_DEBUG_ERROR_OSNET(("inittcpsrv error (%s) : %s(address=%s, port=%s, maxnbcli=%d, timeout=%d)\n", 
			strtime_m(), 
			"bind failed. ", 
			address, port, maxnbcli, timeout));
		closesocket(*pSock);
#ifdef _WIN32
		WSACleanup();
#endif // _WIN32
		return EXIT_FAILURE;
	}

	// Set the number of simultaneous client connections that can be accepted by the server.
	if (listen(*pSock, maxnbcli) != EXIT_SUCCESS)
	{
		PRINT_DEBUG_ERROR_OSNET(("inittcpsrv error (%s) : %s(address=%s, port=%s, maxnbcli=%d, timeout=%d)\n", 
			strtime_m(), 
			"listen failed. ", 
			address, port, maxnbcli, timeout));
		closesocket(*pSock);
#ifdef _WIN32
		WSACleanup();
#endif // _WIN32
		return EXIT_FAILURE;
	}

	return EXIT_SUCCESS;
}